

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int StrReplaceWalker(jx9_value *pKey,jx9_value *pData,void *pUserData)

{
  char *pSrc;
  void *pDest;
  int nByte;
  SyString sWorker;
  uint local_2c;
  void *local_28;
  sxu32 local_20;
  
  pSrc = jx9_value_to_string(pData,(int *)&local_2c);
  local_28 = (void *)0x0;
  local_20 = 0;
  if (0 < (int)local_2c) {
    pDest = jx9_context_alloc_chunk(*(jx9_context **)((long)pUserData + 0x18),local_2c,0,1);
    if (pDest == (void *)0x0) {
      jx9VmThrowError((jx9_vm *)(*(long **)((long)pUserData + 0x18))[0xc],
                      (SyString *)(**(long **)((long)pUserData + 0x18) + 8),1,
                      "JX9 is running out of memory");
      return 0;
    }
    SyMemcpy(pSrc,pDest,local_2c);
    local_20 = local_2c;
    local_28 = pDest;
  }
  SySetPut(*(SySet **)((long)pUserData + 0x10),&local_28);
  return 0;
}

Assistant:

static int StrReplaceWalker(jx9_value *pKey, jx9_value *pData, void *pUserData)
{
	str_replace_data *pRep = (str_replace_data *)pUserData;
	SyString sWorker;
	const char *zIn;
	int nByte;
	/* Extract a string representation of the given argument */
	zIn = jx9_value_to_string(pData, &nByte);
	SyStringInitFromBuf(&sWorker, 0, 0);
	if( nByte > 0 ){
		char *zDup;
		/* Duplicate the chunk */
		zDup = (char *)jx9_context_alloc_chunk(pRep->pCtx, (unsigned int)nByte, FALSE, 
			TRUE /* Release the chunk automatically, upon this context is destroyd */
			);
		if( zDup == 0 ){
			/* Ignore any memory failure problem */
			jx9_context_throw_error(pRep->pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			return JX9_OK;
		}
		SyMemcpy(zIn, zDup, (sxu32)nByte);
		/* Save the chunk */
		SyStringInitFromBuf(&sWorker, zDup, nByte);
	}
	/* Save for later processing */
	SySetPut(pRep->pCollector, (const void *)&sWorker);
	/* All done */
	SXUNUSED(pKey); /* cc warning */
	return JX9_OK;
}